

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O3

bool __thiscall tcu::TestSessionExecutor::iterate(TestSessionExecutor *this)

{
  TestHierarchyIterator *this_00;
  TestCaseExecutor *pTVar1;
  byte bVar2;
  bool bVar3;
  State SVar4;
  int iVar5;
  IterateResult IVar6;
  string *casePath;
  undefined4 extraout_var;
  TestNode *pTVar7;
  
  if (this->m_abortSession != false) {
    return false;
  }
  this_00 = &this->m_iterator;
  bVar2 = 0;
  do {
    if (this->m_state == STATE_TRAVERSE_HIERARCHY) {
      SVar4 = TestHierarchyIterator::getState(this_00);
      if (STATE_LEAVE_NODE < SVar4) {
        (this->m_status).isComplete = true;
        return false;
      }
      pTVar7 = TestHierarchyIterator::getNode(this_00);
      if (pTVar7->m_nodeType - NODETYPE_SELF_VALIDATE < 4) {
        if (SVar4 == STATE_ENTER_NODE) {
          casePath = TestHierarchyIterator::getNodePath_abi_cxx11_(this_00);
          bVar3 = enterTestCase(this,(TestCase *)pTVar7,casePath);
          if (bVar3) {
            this->m_state = STATE_EXECUTE_TEST_CASE;
          }
        }
        else {
          leaveTestCase(this,(TestCase *)pTVar7);
        }
      }
      else if (pTVar7->m_nodeType == NODETYPE_PACKAGE) {
        if (SVar4 == STATE_ENTER_NODE) {
          iVar5 = (*pTVar7->_vptr_TestNode[5])(pTVar7);
          pTVar1 = (this->m_caseExecutor).
                   super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
                   .m_data.ptr;
          if (pTVar1 != (TestCaseExecutor *)CONCAT44(extraout_var,iVar5)) {
            if (pTVar1 != (TestCaseExecutor *)0x0) {
              (*pTVar1->_vptr_TestCaseExecutor[1])();
            }
            (this->m_caseExecutor).
            super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.
            m_data.ptr = (TestCaseExecutor *)CONCAT44(extraout_var,iVar5);
          }
        }
        else {
          pTVar1 = (this->m_caseExecutor).
                   super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
                   .m_data.ptr;
          if (pTVar1 != (TestCaseExecutor *)0x0) {
            (*pTVar1->_vptr_TestCaseExecutor[1])();
            (this->m_caseExecutor).
            super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.
            m_data.ptr = (TestCaseExecutor *)0x0;
          }
        }
      }
      TestHierarchyIterator::next(this_00);
      bVar2 = this->m_abortSession;
    }
    else if (this->m_state == STATE_EXECUTE_TEST_CASE) {
      pTVar7 = TestHierarchyIterator::getNode(this_00);
      IVar6 = iterateTestCase(this,(TestCase *)pTVar7);
      if (IVar6 == STOP) {
        this->m_state = STATE_TRAVERSE_HIERARCHY;
        return true;
      }
      return true;
    }
  } while ((bVar2 & 1) == 0);
  return false;
}

Assistant:

bool TestSessionExecutor::iterate (void)
{
	while (!m_abortSession)
	{
		switch (m_state)
		{
			case STATE_TRAVERSE_HIERARCHY:
			{
				const TestHierarchyIterator::State	hierIterState	= m_iterator.getState();

				if (hierIterState == TestHierarchyIterator::STATE_ENTER_NODE ||
					hierIterState == TestHierarchyIterator::STATE_LEAVE_NODE)
				{
					TestNode* const		curNode		= m_iterator.getNode();
					const TestNodeType	nodeType	= curNode->getNodeType();
					const bool			isEnter		= hierIterState == TestHierarchyIterator::STATE_ENTER_NODE;

					switch (nodeType)
					{
						case NODETYPE_PACKAGE:
						{
							TestPackage* const testPackage = static_cast<TestPackage*>(curNode);
							isEnter ? enterTestPackage(testPackage) : leaveTestPackage(testPackage);
							break;
						}

						case NODETYPE_GROUP:
							break; // nada

						case NODETYPE_SELF_VALIDATE:
						case NODETYPE_PERFORMANCE:
						case NODETYPE_CAPABILITY:
						case NODETYPE_ACCURACY:
						{
							TestCase* const testCase = static_cast<TestCase*>(curNode);

							if (isEnter)
							{
								if (enterTestCase(testCase, m_iterator.getNodePath()))
									m_state = STATE_EXECUTE_TEST_CASE;
								// else remain in TRAVERSING_HIERARCHY => node will be exited from in the next iteration
							}
							else
								leaveTestCase(testCase);

							break;
						}

						default:
							DE_ASSERT(false);
							break;
					}

					m_iterator.next();
					break;
				}
				else
				{
					DE_ASSERT(hierIterState == TestHierarchyIterator::STATE_FINISHED);
					m_status.isComplete = true;
					return false;
				}
			}

			case STATE_EXECUTE_TEST_CASE:
			{
				DE_ASSERT(m_iterator.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
						  isTestNodeTypeExecutable(m_iterator.getNode()->getNodeType()));

				TestCase* const					testCase	= static_cast<TestCase*>(m_iterator.getNode());
				const TestCase::IterateResult	iterResult	= iterateTestCase(testCase);

				if (iterResult == TestCase::STOP)
					m_state = STATE_TRAVERSE_HIERARCHY;

				return true;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	return false;
}